

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::HttpSocket::IsRedirecting(HttpSocket *this)

{
  uint uVar1;
  HttpSocket *this_local;
  
  uVar1 = this->_status;
  if ((uVar1 - 0x12d < 3) || (uVar1 == 0x133 || uVar1 == 0x134)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HttpSocket::IsRedirecting() const
{
    switch(_status)
    {
        case 301:
        case 302:
        case 303:
        case 307:
        case 308:
            return true;
    }
    return false;
}